

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O2

void __thiscall mocker::ast::VarDeclStmt::~VarDeclStmt(VarDeclStmt *this)

{
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__VarDeclStmt_001f30a0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->initExpr).
              super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->identifier).
              super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->type).super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_Statement).super_ASTNode.
              super_enable_shared_from_this<mocker::ast::ASTNode>._M_weak_this.
              super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

VarDeclStmt(std::shared_ptr<Type> type,
              std::shared_ptr<Identifier> identifier,
              std::shared_ptr<Expression> initExpr = nullptr)
      : type(std::move(type)), identifier(std::move(identifier)),
        initExpr(std::move(initExpr)) {}